

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

SrcList * sqlite3SrcListAppendFromTerm
                    (Parse *pParse,SrcList *p,Token *pTable,Token *pDatabase,Token *pAlias,
                    Select *pSubquery,OnOrUsing *pOnUsing)

{
  undefined1 *puVar1;
  int iVar2;
  sqlite3 *db;
  int iVar3;
  SrcList *pSVar4;
  anon_union_8_2_eeb63324_for_u3 aVar5;
  char *pcVar6;
  
  db = pParse->db;
  if (pOnUsing == (OnOrUsing *)0x0 || p != (SrcList *)0x0) {
LAB_0016649d:
    pSVar4 = sqlite3SrcListAppend(pParse,p,pTable,pDatabase);
    if (pSVar4 != (SrcList *)0x0) {
      iVar2 = pSVar4->nSrc;
      if ((1 < pParse->eParseMode) &&
         (pcVar6 = pSVar4->a[(long)iVar2 + -1].zName, pcVar6 != (char *)0x0)) {
        if ((pDatabase == (Token *)0x0) || (pDatabase->z == (char *)0x0)) {
          pDatabase = pTable;
        }
        sqlite3RenameTokenMap(pParse,pcVar6,pDatabase);
      }
      if (pAlias->n != 0) {
        pcVar6 = sqlite3NameFromToken(db,pAlias);
        pSVar4->a[(long)iVar2 + -1].zAlias = pcVar6;
      }
      if (((pSubquery != (Select *)0x0) &&
          (iVar3 = sqlite3SrcItemAttachSubquery(pParse,pSVar4->a + (long)iVar2 + -1,pSubquery,0),
          iVar3 != 0)) && ((pSubquery->selFlags & 0x800) != 0)) {
        puVar1 = &pSVar4->a[(long)iVar2 + -1].fg.field_0x2;
        *puVar1 = *puVar1 | 0x40;
      }
      if (pOnUsing != (OnOrUsing *)0x0) {
        if (pOnUsing->pUsing == (IdList *)0x0) {
          aVar5 = (anon_union_8_2_eeb63324_for_u3)pOnUsing->pOn;
        }
        else {
          puVar1 = &pSVar4->a[(long)iVar2 + -1].fg.field_0x2;
          *puVar1 = *puVar1 | 8;
          aVar5 = (anon_union_8_2_eeb63324_for_u3)pOnUsing->pUsing;
        }
        pSVar4->a[(long)iVar2 + -1].u3 = aVar5;
        return pSVar4;
      }
      pSVar4->a[(long)iVar2 + -1].u3.pOn = (Expr *)0x0;
      return pSVar4;
    }
    if (pOnUsing == (OnOrUsing *)0x0) goto LAB_00166584;
  }
  else {
    if (pOnUsing->pOn == (Expr *)0x0) {
      if (pOnUsing->pUsing == (IdList *)0x0) goto LAB_0016649d;
      pcVar6 = "USING";
    }
    else {
      pcVar6 = "ON";
    }
    sqlite3ErrorMsg(pParse,"a JOIN clause is required before %s",pcVar6);
  }
  if (pOnUsing->pOn == (Expr *)0x0) {
    if (pOnUsing->pUsing != (IdList *)0x0) {
      sqlite3IdListDelete(db,pOnUsing->pUsing);
    }
  }
  else {
    sqlite3ExprDeleteNN(db,pOnUsing->pOn);
  }
LAB_00166584:
  sqlite3SelectDelete(db,pSubquery);
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendFromTerm(
  Parse *pParse,          /* Parsing context */
  SrcList *p,             /* The left part of the FROM clause already seen */
  Token *pTable,          /* Name of the table to add to the FROM clause */
  Token *pDatabase,       /* Name of the database containing pTable */
  Token *pAlias,          /* The right-hand side of the AS subexpression */
  Select *pSubquery,      /* A subquery used in place of a table name */
  OnOrUsing *pOnUsing     /* Either the ON clause or the USING clause */
){
  SrcItem *pItem;
  sqlite3 *db = pParse->db;
  if( !p && pOnUsing!=0 && (pOnUsing->pOn || pOnUsing->pUsing) ){
    sqlite3ErrorMsg(pParse, "a JOIN clause is required before %s",
      (pOnUsing->pOn ? "ON" : "USING")
    );
    goto append_from_error;
  }
  p = sqlite3SrcListAppend(pParse, p, pTable, pDatabase);
  if( p==0 ){
    goto append_from_error;
  }
  assert( p->nSrc>0 );
  pItem = &p->a[p->nSrc-1];
  assert( (pTable==0)==(pDatabase==0) );
  assert( pItem->zName==0 || pDatabase!=0 );
  if( IN_RENAME_OBJECT && pItem->zName ){
    Token *pToken = (ALWAYS(pDatabase) && pDatabase->z) ? pDatabase : pTable;
    sqlite3RenameTokenMap(pParse, pItem->zName, pToken);
  }
  assert( pAlias!=0 );
  if( pAlias->n ){
    pItem->zAlias = sqlite3NameFromToken(db, pAlias);
  }
  assert( pSubquery==0 || pDatabase==0 );
  if( pSubquery ){
    if( sqlite3SrcItemAttachSubquery(pParse, pItem, pSubquery, 0) ){
      if( pSubquery->selFlags & SF_NestedFrom ){
        pItem->fg.isNestedFrom = 1;
      }
    }
  }
  assert( pOnUsing==0 || pOnUsing->pOn==0 || pOnUsing->pUsing==0 );
  assert( pItem->fg.isUsing==0 );
  if( pOnUsing==0 ){
    pItem->u3.pOn = 0;
  }else if( pOnUsing->pUsing ){
    pItem->fg.isUsing = 1;
    pItem->u3.pUsing = pOnUsing->pUsing;
  }else{
    pItem->u3.pOn = pOnUsing->pOn;
  }
  return p;

append_from_error:
  assert( p==0 );
  sqlite3ClearOnOrUsing(db, pOnUsing);
  sqlite3SelectDelete(db, pSubquery);
  return 0;
}